

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

int __thiscall
QtMWidgets::NavigationBar::setMainWidget(NavigationBar *this,QString *title,QWidget *widget)

{
  QWidget *pQVar1;
  NavigationBarPrivate *pNVar2;
  NavigationItem *pNVar3;
  reference pQVar4;
  QSharedPointer<QtMWidgets::NavigationItem> *this_00;
  QSharedPointer<QtMWidgets::NavigationItem> local_38;
  int local_24;
  QWidget *pQStack_20;
  int index;
  QWidget *widget_local;
  QString *title_local;
  NavigationBar *this_local;
  
  pQStack_20 = widget;
  widget_local = (QWidget *)title;
  title_local = (QString *)this;
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  local_24 = QStackedWidget::addWidget((QWidget *)pNVar2->stack);
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pNVar3 = (NavigationItem *)operator_new(0x40);
  NavigationItem::NavigationItem(pNVar3);
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer<QtMWidgets::NavigationItem,_true>
            (&local_38,pNVar3);
  QList<QSharedPointer<QtMWidgets::NavigationItem>_>::append(&pNVar2->rootItems,&local_38);
  QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer(&local_38);
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pQVar4 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::back(&pNVar2->rootItems);
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  this_00 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                      (&pNVar2->itemsMap,&stack0xffffffffffffffe0);
  QSharedPointer<QtMWidgets::NavigationItem>::operator=(this_00,pQVar4);
  pQVar1 = widget_local;
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pQVar4 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::back(&pNVar2->rootItems);
  pNVar3 = QSharedPointer<QtMWidgets::NavigationItem>::operator->(pQVar4);
  QString::operator=(&pNVar3->title,(QString *)pQVar1);
  pQVar1 = pQStack_20;
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pQVar4 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::back(&pNVar2->rootItems);
  pNVar3 = QSharedPointer<QtMWidgets::NavigationItem>::operator->(pQVar4);
  pNVar3->self = pQVar1;
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  QStackedWidget::setCurrentIndex((int)pNVar2->stack);
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  TextLabel::setText(pNVar2->title,(QString *)widget_local);
  return local_24;
}

Assistant:

int
NavigationBar::setMainWidget( const QString & title,
	QWidget * widget )
{
	const int index = d->stack->addWidget( widget );

	d->rootItems.append(
		QSharedPointer< NavigationItem > ( new NavigationItem ) );
	d->itemsMap[ widget ] = d->rootItems.back();

	d->rootItems.back()->title = title;
	d->rootItems.back()->self = widget;

	d->stack->setCurrentIndex( index );
	d->title->setText( title );

	return index;
}